

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_pop(REF_LIST ref_list,REF_INT *last)

{
  bool bVar1;
  REF_INT *last_local;
  REF_LIST ref_list_local;
  
  bVar1 = ref_list->n != 0;
  if (bVar1) {
    ref_list->n = ref_list->n + -1;
    *last = ref_list->value[ref_list->n];
  }
  else {
    *last = -1;
  }
  ref_list_local._4_4_ = (uint)!bVar1;
  return ref_list_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_list_pop(REF_LIST ref_list, REF_INT *last) {
  if (0 == ref_list_n(ref_list)) {
    *last = REF_EMPTY;
    return REF_FAILURE;
  }

  ref_list_n(ref_list)--;
  *last = ref_list->value[ref_list_n(ref_list)];

  return REF_SUCCESS;
}